

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O2

void test_cpp_add_range_open_64(void **param_1)

{
  ulong max;
  bool bVar1;
  uint32_t v;
  uint32_t x;
  uint64_t v_1;
  uint64_t min;
  pointer ppVar2;
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> __l;
  Roaring64Map r2;
  Roaring64Map r1;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ranges;
  
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  r1.roarings._M_t._M_impl._0_8_ = 0;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  r1._48_8_ = r1._48_8_ & 0xffffffffffffff00;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  roaring::Roaring64Map::addRangeClosed(&r1,1,4);
  r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header;
  r2.roarings._M_t._M_impl._0_8_ = 0;
  r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  r2.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  r2.copyOnWrite = false;
  r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (x = 1; x != 5; x = x + 1) {
    roaring::Roaring64Map::add(&r2,x);
  }
  bVar1 = roaring::Roaring64Map::operator==(&r1,&r2);
  _assert_true((ulong)bVar1,"r1 == r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x395);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&r2);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&r1);
  r1.roarings._M_t._M_impl._0_8_ = 0x100000000;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 10;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 1;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0xfffffff6;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x10000000a;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x100000064;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0x100000064;
  r1.copyOnWrite = true;
  r1._49_7_ = 0x1000000;
  __l._M_len = 4;
  __l._M_array = (iterator)&r1;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&ranges,__l,(allocator_type *)&r2);
  for (ppVar2 = ranges.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar2 != ranges.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar2 = ppVar2 + 1) {
    min = ppVar2->first;
    max = ppVar2->second;
    r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    r1.roarings._M_t._M_impl._0_8_ = 0;
    r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header;
    r1.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    r1._48_8_ = r1._48_8_ & 0xffffffffffffff00;
    r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    roaring::Roaring64Map::addRange(&r1,min,max);
    r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    r2.roarings._M_t._M_impl._0_8_ = 0;
    r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header;
    r2.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    r2.copyOnWrite = false;
    r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (; min < max; min = min + 1) {
      roaring::Roaring64Map::add(&r2,min);
    }
    bVar1 = roaring::Roaring64Map::operator==(&r1,&r2);
    _assert_true((ulong)bVar1,"r1 == r2",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                 ,0x3a6);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                 *)&r2);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                 *)&r1);
  }
  std::
  _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Vector_base(&ranges.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 );
  return;
}

Assistant:

DEFINE_TEST(test_example_true) { test_example(true); }